

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::FindMakeProgram(cmGlobalNinjaGenerator *this,cmMakefile *mf)

{
  char *pcVar1;
  string version;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  string local_38;
  
  cmGlobalGenerator::FindMakeProgram((cmGlobalGenerator *)this,mf);
  std::__cxx11::string::string((string *)&local_78,"CMAKE_MAKE_PROGRAM",(allocator *)&local_38);
  pcVar1 = cmMakefile::GetDefinition(mf,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&this->NinjaCommand);
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_58,&this->NinjaCommand);
    std::__cxx11::string::string((string *)&local_78,"--version",(allocator *)&local_38);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
               &local_78);
    std::__cxx11::string::~string((string *)&local_78);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    cmSystemTools::RunSingleCommand
              (&local_58,&local_78,(string *)0x0,(int *)0x0,(char *)0x0,OUTPUT_NONE,0.0);
    cmSystemTools::TrimWhitespace(&local_38,&local_78);
    std::__cxx11::string::operator=((string *)&this->NinjaVersion,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::FindMakeProgram(cmMakefile* mf)
{
  this->cmGlobalGenerator::FindMakeProgram(mf);
  if (const char* ninjaCommand = mf->GetDefinition("CMAKE_MAKE_PROGRAM"))
    {
    this->NinjaCommand = ninjaCommand;
    std::vector<std::string> command;
    command.push_back(this->NinjaCommand);
    command.push_back("--version");
    std::string version;
    cmSystemTools::RunSingleCommand(command,
                                    &version, 0, 0, 0,
                                    cmSystemTools::OUTPUT_NONE);
    this->NinjaVersion = cmSystemTools::TrimWhitespace(version);
    }
}